

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.h
# Opt level: O0

SmartPtr<Event> * __thiscall SmartPtr<Event>::operator=(SmartPtr<Event> *this,Event *obj)

{
  Event *obj_local;
  SmartPtr<Event> *this_local;
  
  if (obj != (Event *)0x0) {
    RefCount::AddRef(&obj->super_RefCount);
  }
  if (this->mObj != (Event *)0x0) {
    RefCount::Release(&this->mObj->super_RefCount);
  }
  this->mObj = obj;
  return this;
}

Assistant:

SmartPtr &operator=( T *obj )	
	{ 
		//printf( "SmartPtr = start\n" );
		if ( obj != NULL)
		{
			obj->AddRef();
		}

		if ( mObj != NULL )
			mObj->Release();
		mObj = obj;
		
		//printf( "SmartPtr = stop\n" );
		return *this;
	}